

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessTools.cxx
# Opt level: O2

void cmProcessTools::RunProcess
               (cmsysProcess_s *cp,OutputParser *out,OutputParser *err,Encoding encoding)

{
  int iVar1;
  cmProcessOutput processOutput;
  int length;
  string strdata;
  char *data;
  string local_70;
  string local_50;
  
  cmsysProcess_Execute(cp);
  data = (char *)0x0;
  length = 0;
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
LAB_004ad238:
  do {
    do {
      if (out == (OutputParser *)0x0 && err == (OutputParser *)0x0) {
LAB_004ad3a4:
        cmsysProcess_WaitForExit(cp,(double *)0x0);
        std::__cxx11::string::~string((string *)&strdata);
        return;
      }
      iVar1 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0);
      if (iVar1 == 0) {
        if (out != (OutputParser *)0x0) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          local_50._M_string_length = 0;
          local_50.field_2._M_local_buf[0] = '\0';
          cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,1);
          std::__cxx11::string::~string((string *)&local_50);
          if (strdata._M_string_length != 0) {
            (*out->_vptr_OutputParser[2])(out);
          }
        }
        if (err != (OutputParser *)0x0) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          local_70._M_string_length = 0;
          local_70.field_2._M_local_buf[0] = '\0';
          cmProcessOutput::DecodeText(&processOutput,&local_70,&strdata,2);
          std::__cxx11::string::~string((string *)&local_70);
          if (strdata._M_string_length != 0) {
            (*err->_vptr_OutputParser[2])(err);
          }
        }
        goto LAB_004ad3a4;
      }
      if (iVar1 == 2 && out != (OutputParser *)0x0) {
        cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,1);
        iVar1 = (*out->_vptr_OutputParser[2])
                          (out,strdata._M_dataplus._M_p,strdata._M_string_length & 0xffffffff);
        if ((char)iVar1 == '\0') {
          out = (OutputParser *)0x0;
        }
        goto LAB_004ad238;
      }
    } while (iVar1 != 3 || err == (OutputParser *)0x0);
    cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,2);
    iVar1 = (*err->_vptr_OutputParser[2])
                      (err,strdata._M_dataplus._M_p,strdata._M_string_length & 0xffffffff);
    if ((char)iVar1 == '\0') {
      err = (OutputParser *)0x0;
    }
  } while( true );
}

Assistant:

void cmProcessTools::RunProcess(struct cmsysProcess_s* cp, OutputParser* out,
                                OutputParser* err, Encoding encoding)
{
  cmsysProcess_Execute(cp);
  char* data = nullptr;
  int length = 0;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((out || err) &&
         (p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    if (out && p == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      if (!out->Process(strdata.c_str(), static_cast<int>(strdata.size()))) {
        out = nullptr;
      }
    } else if (err && p == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      if (!err->Process(strdata.c_str(), static_cast<int>(strdata.size()))) {
        err = nullptr;
      }
    }
  }
  if (out) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      out->Process(strdata.c_str(), static_cast<int>(strdata.size()));
    }
  }
  if (err) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      err->Process(strdata.c_str(), static_cast<int>(strdata.size()));
    }
  }
  cmsysProcess_WaitForExit(cp, nullptr);
}